

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  char *buf;
  byte bVar1;
  int iVar2;
  xmlElementType xVar3;
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr out_00;
  xmlChar *pxVar4;
  bool bVar5;
  xmlDocPtr pxVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  xmlBufferPtr buf_00;
  _xmlNode *p_Var11;
  ulong uVar12;
  xmlChar *pxVar13;
  _xmlDtd *p_Var14;
  int *piVar15;
  _xmlDtd *p_Var16;
  char *pcVar17;
  long lVar18;
  int len;
  long lVar19;
  _xmlDtd *p_Var20;
  _xmlDtd *p_Var21;
  _xmlDtd **pp_Var22;
  xmlBufPtr buf_01;
  xmlDocPtr cur_00;
  bool bVar23;
  _xmlDtd *local_78;
  int local_6c;
  _xmlNode **local_68;
  xmlDocPtr local_48;
  
  iVar2 = ctxt->format;
  out = ctxt->buf;
  buf = ctxt->indent;
  local_48 = (xmlDocPtr)0x0;
  pxVar6 = (xmlDocPtr)cur;
LAB_001a73dd:
  cur_00 = pxVar6;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar15 = __xmlIndentTreeOutput(), *piVar15 != 0)) {
      iVar10 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar10 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,"<");
    }
    else {
      smlWriteSemiColonIfNeeded(out);
    }
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar17 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar17 != (char *)0x0)) {
      xmlOutputBufferWriteString(out,pcVar17);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,cur_00->name);
    if (cur_00->oldNs != (xmlNsPtr)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,cur_00->oldNs);
    }
    pp_Var22 = &cur_00->extSubset;
    while (p_Var20 = *pp_Var22, p_Var20 != (_xmlDtd *)0x0) {
      xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var20);
      pp_Var22 = (_xmlDtd **)&p_Var20->next;
    }
    p_Var11 = cur_00->children;
    if (p_Var11 == (_xmlNode *)0x0) {
      uVar9 = ctxt->options;
      if ((uVar9 & 4) == 0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
          uVar9 = ctxt->options;
        }
        if ((uVar9 >> 8 & 1) != 0) break;
        iVar10 = 2;
        pcVar17 = "/>";
      }
      else {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,1);
          uVar9 = ctxt->options;
        }
        if ((uVar9 >> 8 & 1) != 0) {
          pcVar17 = " {}";
          goto LAB_001a7c8f;
        }
        xmlOutputBufferWrite(out,3,"></");
        if ((*(long *)&cur_00->compression != 0) &&
           (pcVar17 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar17 != (char *)0x0)) {
          xmlOutputBufferWriteString(out,pcVar17);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,cur_00->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        iVar10 = 1;
        pcVar17 = ">";
      }
      goto LAB_001a7a9e;
    }
    if (ctxt->format == 2) {
      xmlOutputBufferWriteWSNonSig(ctxt,1);
    }
    else if (ctxt->format == 1) {
      for (; p_Var11 != (_xmlNode *)0x0; p_Var11 = p_Var11->next) {
        if (p_Var11->type - XML_TEXT_NODE < 3) {
          ctxt->format = 0;
          local_48 = cur_00;
          break;
        }
      }
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,">");
    }
    else {
      xmlOutputBufferWrite(out,1," ");
      ctxt->quoted = 0;
    }
    if (((ctxt->options & 0x100) != 0) &&
       ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0)))) {
      xmlOutputBufferWrite(out,1,"{");
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar6 = (xmlDocPtr)cur_00->children;
    goto LAB_001a73dd;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var20 = cur_00->intSubset;
    if ((ctxt->options & 0x100) != 0) {
      if (p_Var20 == (_xmlDtd *)0x0) {
        p_Var20 = (_xmlDtd *)0x1f109e;
        cur_00->intSubset = (_xmlDtd *)0x1f109e;
      }
      if (((cur_00->prev != (_xmlNode *)0x0) && (*(xmlChar *)&p_Var20->_private != '\n')) &&
         (ctxt->quoted == 0)) {
        smlWriteSemiColonIfNeeded(out);
        p_Var20 = cur_00->intSubset;
      }
      out_00 = ctxt->buf;
      iVar10 = xmlStrlen((xmlChar *)p_Var20);
      lVar18 = (long)iVar10;
      p_Var21 = (_xmlDtd *)((long)&p_Var20->_private + lVar18);
      p_Var14 = p_Var20;
      if ((cur_00->prev == (_xmlNode *)0x0) && (cur_00->next == (_xmlNode *)0x0)) {
        bVar23 = false;
LAB_001a7e02:
        bVar5 = bVar23;
        p_Var20 = (_xmlDtd *)0x0;
        local_6c = 0;
      }
      else {
        lVar19 = 0;
        while ((uVar12 = (ulong)*(byte *)((long)&p_Var20->_private + lVar19), uVar12 < 0x21 &&
               ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0))) {
          lVar19 = lVar19 + 1;
        }
        len = (int)lVar19;
        if (len != 0) {
          iVar8 = xmlOutputBufferWrite(out_00,len,(char *)p_Var20);
          if ((iVar8 == -1) ||
             (p_Var14 = (_xmlDtd *)((long)&p_Var20->_private + lVar19),
             *(char *)&p_Var14->_private == '\0')) break;
          iVar10 = iVar10 - len;
        }
        local_6c = 0;
        p_Var20 = (_xmlDtd *)((long)&p_Var20->_private + lVar18);
        while (((p_Var16 = (_xmlDtd *)((long)&p_Var20[-1].pentities + 7), p_Var14 < p_Var16 &&
                ((ulong)*(byte *)&p_Var16->_private < 0x21)) &&
               ((0x100002600U >> ((ulong)*(byte *)&p_Var16->_private & 0x3f) & 1) != 0))) {
          local_6c = local_6c + 1;
          p_Var20 = p_Var16;
        }
        bVar5 = true;
        bVar23 = true;
        if (local_6c == 0) goto LAB_001a7e02;
        p_Var14 = (_xmlDtd *)xmlStrndup((xmlChar *)p_Var14,iVar10 - local_6c);
        if (p_Var14 == (_xmlDtd *)0x0) break;
        p_Var21 = (_xmlDtd *)((long)&p_Var14->_private + (long)(iVar10 - local_6c));
      }
      if (cur_00->prev != (_xmlNode *)0x0) {
        xVar3 = cur_00->prev->type;
        bVar23 = xVar3 != XML_ENTITY_REF_NODE;
        p_Var11 = cur_00->next;
        if (p_Var11 != (_xmlNode *)0x0) goto LAB_001a7e49;
        if (xVar3 != XML_ENTITY_REF_NODE) goto LAB_001a7e53;
        goto LAB_001a7e6f;
      }
      p_Var11 = cur_00->next;
      bVar23 = true;
      if (p_Var11 != (_xmlNode *)0x0) {
LAB_001a7e49:
        if ((p_Var11->type == XML_ENTITY_REF_NODE) || (!bVar23)) goto LAB_001a7e6f;
      }
LAB_001a7e53:
      if (ctxt->quoted == 0) {
        if (*(char *)&p_Var14->_private == '\0' || bVar5) {
LAB_001a7e6f:
          if (ctxt->quoted == 0) {
            iVar10 = xmlOutputBufferWrite(out_00,1,"\"");
            if (iVar10 == -1) break;
            ctxt->quoted = 1;
          }
          goto LAB_001a7ea0;
        }
        uVar12 = 0x5c;
        for (p_Var16 = p_Var14; p_Var16 < p_Var21;
            p_Var16 = (_xmlDtd *)xmlNextUTF8Char((xmlChar *)p_Var16)) {
          bVar1 = *(byte *)&p_Var16->_private;
          uVar12 = (ulong)bVar1;
          if (((uVar12 < 0x3f) && ((0x7800004d00002600U >> (uVar12 & 0x3f) & 1) != 0)) ||
             ((bVar1 == 0x7b || (bVar1 == 0x7d)))) goto LAB_001a7e6f;
        }
        if ((char)uVar12 == '\\') goto LAB_001a7e6f;
        iVar10 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var14,smlEscapeRawString);
LAB_001a7eea:
        if (iVar10 == -1) break;
      }
      else {
LAB_001a7ea0:
        local_68 = &cur_00->next;
        iVar10 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var14,smlEscapeQuotedString);
        if (iVar10 == -1) break;
        if ((*local_68 == (_xmlNode *)0x0) || ((*local_68)->type != XML_ENTITY_REF_NODE)) {
          ctxt->quoted = 0;
          iVar10 = xmlOutputBufferWrite(out_00,1,"\"");
          goto LAB_001a7eea;
        }
      }
      if ((bVar5 && p_Var20 != (_xmlDtd *)0x0) &&
         (iVar10 = xmlOutputBufferWrite(out_00,local_6c,(char *)p_Var20), iVar10 != -1)) {
        (*xmlFree)(p_Var14);
      }
      break;
    }
    if (p_Var20 == (_xmlDtd *)0x0) break;
    if ((xmlChar *)cur_00->name != "textnoenc") {
      xmlOutputBufferWriteEscape(out,(xmlChar *)p_Var20,ctxt->escape);
      break;
    }
    goto LAB_001a79cd;
  case XML_CDATA_SECTION_NODE:
    local_78 = (_xmlDtd *)0x1eed4f;
    if ((ctxt->options & 0x100) != 0) {
      smlWriteSemiColonIfNeeded(out);
      local_78 = (_xmlDtd *)0x1f6563;
    }
    p_Var20 = cur_00->intSubset;
    if ((p_Var20 != (_xmlDtd *)0x0) &&
       (cVar7 = *(char *)&p_Var20->_private, p_Var21 = p_Var20, cVar7 != '\0')) {
      do {
        if (cVar7 == ']') {
          if ((*(char *)((long)&p_Var20->_private + 1) == ']') &&
             (*(char *)((long)&p_Var20->_private + 2) == '>')) {
            p_Var20 = (_xmlDtd *)((long)&p_Var20->_private + 2);
            xmlOutputBufferWriteString(out,(char *)local_78);
            xmlOutputBufferWrite(out,(int)p_Var20 - (int)p_Var21,(char *)p_Var21);
            xmlOutputBufferWriteString(out,"]]>");
            p_Var21 = p_Var20;
          }
        }
        else if (cVar7 == '\0') goto LAB_001a79a3;
        cVar7 = *(char *)((long)&p_Var20->_private + 1);
        p_Var20 = (_xmlDtd *)((long)&p_Var20->_private + 1);
      } while( true );
    }
    goto LAB_001a79be;
  case XML_ENTITY_REF_NODE:
    if (((ctxt->options & 0x100) != 0) && (ctxt->quoted == 0)) {
      xmlOutputBufferWrite(out,1,"\"");
      ctxt->quoted = 1;
    }
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,cur_00->name);
    xmlOutputBufferWrite(out,1,";");
    if (((ctxt->options & 0x100) != 0) &&
       ((p_Var11 = cur_00->next, p_Var11 == (_xmlNode *)0x0 ||
        ((p_Var11->type != XML_ENTITY_REF_NODE &&
         ((p_Var11->type != XML_TEXT_NODE ||
          (iVar10 = xmlStrIsAllBlank(p_Var11->content), iVar10 != 0)))))))) {
      pcVar17 = "\"";
LAB_001a7c8f:
      xmlOutputBufferWrite(out,1,pcVar17);
      ctxt->quoted = 0;
    }
    break;
  case XML_PI_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar15 = __xmlIndentTreeOutput(), *piVar15 != 0)) {
      iVar10 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar10 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
    }
    p_Var20 = cur_00->intSubset;
    xmlOutputBufferWrite(out,2,"<?");
    xmlOutputBufferWriteString(out,cur_00->name);
    if (p_Var20 == (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
    }
    else if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      else {
        xmlOutputBufferWrite(out,1," ");
      }
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
    }
    iVar10 = 2;
    pcVar17 = "?>";
LAB_001a7a9e:
    xmlOutputBufferWrite(out,iVar10,pcVar17);
    break;
  case XML_COMMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar15 = __xmlIndentTreeOutput(), *piVar15 != 0)) {
      iVar10 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar10 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
    }
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if ((ctxt->options & 0x100) == 0) {
        xmlOutputBufferWrite(out,4,"<!--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar10 = 3;
        pcVar17 = "-->";
      }
      else {
        smlWriteSemiColonIfNeeded(out);
        pxVar13 = xmlStrchr((xmlChar *)cur_00->intSubset,'\n');
        if (pxVar13 == (xmlChar *)0x0) {
          if ((ctxt->format != 0) || ((_xmlDoc *)cur_00->parent == cur_00->doc)) {
LAB_001a7bb6:
            xmlOutputBufferWrite(out,1,"#");
            p_Var20 = cur_00->intSubset;
            goto LAB_001a79cd;
          }
          p_Var11 = cur_00->next;
          if ((p_Var11 != (_xmlNode *)0x0) && (p_Var11->type == XML_TEXT_NODE)) {
            pxVar13 = p_Var11->content;
            iVar10 = xmlStrIsAllBlank(pxVar13);
            if ((iVar10 != 0) && (*pxVar13 == '\n')) goto LAB_001a7bb6;
          }
        }
        xmlOutputBufferWrite(out,3,"#--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar10 = 2;
        pcVar17 = "--";
      }
      goto LAB_001a7a9e;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,cur_00);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    goto switchD_001a73fc_caseD_b;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    buf_01 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpElementDecl(buf_01,(xmlElementPtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpElementDecl(buf_00,(xmlElementPtr)cur_00);
LAB_001a7928:
        pxVar4 = buf_00->content;
        uVar9 = buf_00->use;
        pxVar13 = pxVar4 + (long)(int)uVar9 + -2;
        pxVar13[0] = '\n';
        pxVar13[1] = '0';
        xmlBufAdd(buf_01,pxVar4 + 1,uVar9 - 2);
        xmlBufferFree(buf_00);
      }
    }
    break;
  case XML_ATTRIBUTE_DECL:
    buf_01 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpAttributeDecl(buf_01,(xmlAttributePtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpAttributeDecl(buf_00,(xmlAttributePtr)cur_00);
        goto LAB_001a7928;
      }
    }
    break;
  case XML_ENTITY_DECL:
    buf_01 = out->buffer;
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpEntityDecl(buf_01,(xmlEntityPtr)cur_00);
    }
    else {
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpEntityDecl(buf_00,(xmlEntityPtr)cur_00);
        goto LAB_001a7928;
      }
    }
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutputCtxt(ctxt,(xmlNsPtr)cur_00);
  }
switchD_001a73fc_caseD_6:
  while( true ) {
    if (cur_00 == (xmlDocPtr)cur) {
      return;
    }
    if ((ctxt->format == 1) && (1 < cur_00->type - XML_XINCLUDE_START)) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    pxVar6 = (xmlDocPtr)cur_00->next;
    if ((xmlDocPtr)cur_00->next != (xmlDocPtr)0x0) break;
    cur_00 = (xmlDocPtr)cur_00->parent;
    if (cur_00 == (xmlDocPtr)0x0) {
      return;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar15 = __xmlIndentTreeOutput();
      if ((*piVar15 != 0) && (ctxt->format == 1)) {
        iVar10 = ctxt->indent_nr;
        if (ctxt->level < ctxt->indent_nr) {
          iVar10 = ctxt->level;
        }
        xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
      }
      uVar9 = ctxt->options;
      if (((uVar9 >> 8 & 1) != 0) &&
         ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0))))
      {
        xmlOutputBufferWrite(out,1,"}");
        uVar9 = ctxt->options;
      }
      if ((uVar9 >> 8 & 1) == 0) {
        xmlOutputBufferWrite(out,2,"</");
        if ((*(xmlNs **)&cur_00->compression != (xmlNs *)0x0) &&
           (pxVar13 = (*(xmlNs **)&cur_00->compression)->prefix, pxVar13 != (xmlChar *)0x0)) {
          xmlOutputBufferWriteString(out,(char *)pxVar13);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,cur_00->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(out,1,">");
      }
      if (cur_00 == local_48) {
        ctxt->format = iVar2;
        local_48 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_001a73dd;
switchD_001a73fc_caseD_b:
  pxVar6 = (xmlDocPtr)cur_00->children;
  if ((xmlDocPtr)cur_00->children != (xmlDocPtr)0x0) goto LAB_001a73dd;
  goto switchD_001a73fc_caseD_6;
LAB_001a79a3:
  if (p_Var21 != p_Var20) {
    xmlOutputBufferWriteString(out,(char *)local_78);
    local_78 = p_Var21;
LAB_001a79be:
    xmlOutputBufferWriteString(out,(char *)local_78);
    p_Var20 = (_xmlDtd *)0x1f651a;
LAB_001a79cd:
    xmlOutputBufferWriteString(out,(char *)p_Var20);
  }
  goto switchD_001a73fc_caseD_6;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;
    DEBUG_CODE(
    const char *pszValue;
    char *c0;
    char *c1;
    switch (cur->type) {
    case XML_TEXT_NODE:
    	pszValue = dbgStr(cur->content);
    	c0 = c1 = "";
    	break;
    case XML_ENTITY_REF_NODE:
    	pszValue = cur->name;
    	c0 = "&";
    	c1 = ";";
    	break;
    default:
    	pszValue = cur->name;
    	c0 = "<";
    	c1 = ">";
    	break;
    }
    );

    DEBUG_ENTER(("xmlNodeDumpOutputInternal(%p, %p [%s]%s%s%s);\n", ctxt, cur, pszXmlElementType[cur->type], c0, pszValue, c1));

    if (cur == NULL) RETURN();
    buf = ctxt->buf;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    } else {					/* SML */
	        smlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    }
            break;

        case XML_ATTRIBUTE_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    } else {					/* SML */
	        smlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    }
            break;

        case XML_ENTITY_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    } else {					/* SML */
	        smlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    }
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

	    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		xmlOutputBufferWrite(buf, 1, "<");
	    } else {						/* SML */
		smlWriteSemiColonIfNeeded(buf);
	    }
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    if (!(ctxt->options & XML_SAVE_AS_SML))	{	/* XML */
			xmlOutputBufferWrite(buf, 2, "/>");
		    } /* Else nothing to do as empty tags are implicit for SML */
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
		    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
			xmlOutputBufferWrite(buf, 3, "></");
			if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			    xmlOutputBufferWriteString(buf,
				    (const char *)cur->ns->prefix);
			    xmlOutputBufferWrite(buf, 1, ":");
			}
			xmlOutputBufferWriteString(buf, (const char *)cur->name);
			if (ctxt->format == 2)
			    xmlOutputBufferWriteWSNonSig(ctxt, 0);
			xmlOutputBufferWrite(buf, 1, ">");
		    } else {						/* SML */
			xmlOutputBufferWrite(buf, 1, " {}");
			ctxt->quoted = 0;
		    }
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 1, ">");
		} else {						/* SML */
		    xmlOutputBufferWrite(buf, 1, " ");
		    ctxt->quoted = 0;
		}
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "{");
		}
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		if (cur->content == NULL)
		    break;
		if (cur->name != xmlStringTextNoenc) {
		    xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
		} else {
		    /*
		     * Disable escaping, needed for XSLT
		     */
		    xmlOutputBufferWriteString(buf, (const char *) cur->content);
		}
	    } else {					/* SML */
		if (cur->content == NULL) cur->content = (xmlChar *)"";
		if (cur->prev && (cur->content[0] != '\n') && !ctxt->quoted) {
		    smlWriteSemiColonIfNeeded(buf);
		}
		smlTextNodeDumpOutput(ctxt, cur);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 4, "<!--");
		    xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    xmlOutputBufferWrite(buf, 3, "-->");
		} else {						/* SML */
		    smlWriteSemiColonIfNeeded(buf);
		    /* If the comment does not fit on a single line */
		    DEBUG_PRINTF(("\\x%02X ... \\x%02X\n", cur->content[0], cur->content[xmlStrlen(cur->content)-1]));
		    if (   xmlStrchr(cur->content, '\n')
			/* Or we're not in formatted mode, and can predict that something will follow on the same line */
			|| (   (!ctxt->format)
			       /* Exception for comments at the top level: xmlDocContentDumpOutput() appends an \n after each top node */
			    && (cur->parent != (struct _xmlNode *)cur->doc)
			    && (/* No other sibling node follows, so that there will be a } on the same line */
				   (!cur->next)
				/* Or if it's followed by anything except blank text beginning with a new line */
				|| (cur->next->type != XML_TEXT_NODE)	/* Not text, so there will be a ; then that next node */
				|| (!xmlStrIsAllBlank(cur->next->content)	/* Non blank text, so the first line will be visible or quoted */
				|| (cur->next->content[0] != '\n'))))	/* Blank text, not quoted, but we must preserve the spaces ahead */
			) {		/* Use the long form */
			xmlOutputBufferWrite(buf, 3, "#--");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
			xmlOutputBufferWrite(buf, 2, "--");
		    } else {	/* Use the short 1-line form */
			xmlOutputBufferWrite(buf, 1, "#");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    }
		}
            }
            break;

        case XML_ENTITY_REF_NODE:
	    DEBUG_PRINTF(("# Dumping entity &%s;\n", cur->name));
	    if ((ctxt->options & XML_SAVE_AS_SML) && !ctxt->quoted) { /* SML */
		xmlOutputBufferWrite(buf, 1, "\"");
		ctxt->quoted = 1;
	    }
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
	    if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
		if (!cur->next ||
		    (   (cur->next->type != XML_ENTITY_REF_NODE)
		     && (   (cur->next->type != XML_TEXT_NODE)
			 || xmlStrIsAllBlank(cur->next->content)))) {
		    xmlOutputBufferWrite(buf, 1, "\"");
		    ctxt->quoted = 0;
		}
	    }
            break;

        case XML_CDATA_SECTION_NODE: {
	    const char *pszBeginCData;
	    const char *pszEndCData = "]]>";
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		pszBeginCData = "<![CDATA[";
	    } else {					/* SML */
		pszBeginCData = "<[[";
		smlWriteSemiColonIfNeeded(buf);
	    }
	    if (cur->content == NULL || *cur->content == '\0') {
		xmlOutputBufferWriteString(buf, pszBeginCData);
		xmlOutputBufferWriteString(buf, pszEndCData);
	    } else {
		start = end = cur->content;
		while (*end != '\0') {
		    if ((*end == ']') && (*(end + 1) == ']') &&
			(*(end + 2) == '>')) {
			end = end + 2;
			xmlOutputBufferWriteString(buf, pszBeginCData);
			xmlOutputBufferWrite(buf, end - start, (const char *)start);
			xmlOutputBufferWriteString(buf, pszEndCData);
			start = end;
		    }
		    end++;
		}
		if (start != end) {
		    xmlOutputBufferWriteString(buf, pszBeginCData);
		    xmlOutputBufferWriteString(buf, (const char *)start);
		    xmlOutputBufferWriteString(buf, pszEndCData);
		}
	    }
            break;
        }
        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                RETURN();
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                RETURN();
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "}");
		}

		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 2, "</");
		    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
			xmlOutputBufferWrite(buf, 1, ":");
		    }
	    
		    xmlOutputBufferWriteString(buf, (const char *)cur->name);
		    if (ctxt->format == 2)
			xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    xmlOutputBufferWrite(buf, 1, ">");
		}

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
    RETURN();
}